

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdGetTxInWitness(void *handle,int net_type,char *tx_hex_string,uint32_t txin_index,
                     uint32_t stack_index,char **stack_data)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  bool is_bitcoin;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_2a0;
  ScriptWitness local_288;
  TransactionContext tx;
  TxInReference ref;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5277c7;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0xa09;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_83e357;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. tx is null or empty.",(allocator *)&ref);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (stack_data != (char **)0x0) {
    witness_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    witness_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    witness_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    is_bitcoin = false;
    cfd::capi::ConvertNetType(net_type,&is_bitcoin);
    if (is_bitcoin == true) {
      std::__cxx11::string::string((string *)&ref,tx_hex_string,(allocator *)&local_288);
      cfd::TransactionContext::TransactionContext(&tx,(string *)&ref);
      std::__cxx11::string::~string((string *)&ref);
      cfd::core::Transaction::GetTxIn(&ref,&tx.super_Transaction,txin_index);
      cfd::core::ScriptWitness::ScriptWitness
                (&local_288,&ref.super_AbstractTxInReference.script_witness_);
      cfd::core::ScriptWitness::GetWitness(&local_2a0,&local_288);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&witness_stack,&local_2a0);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_2a0);
      cfd::core::ScriptWitness::~ScriptWitness(&local_288);
      cfd::core::AbstractTxInReference::~AbstractTxInReference(&ref.super_AbstractTxInReference);
      cfd::TransactionContext::~TransactionContext(&tx);
    }
    else {
      std::__cxx11::string::string((string *)&tx,tx_hex_string,(allocator *)&local_288);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&ref,(string *)&tx);
      std::__cxx11::string::~string((string *)&tx);
      cfd::core::ConfidentialTransaction::GetTxIn
                ((ConfidentialTxInReference *)&tx,(ConfidentialTransaction *)&ref,txin_index);
      cfd::core::ScriptWitness::ScriptWitness
                (&local_288,
                 (ScriptWitness *)
                 &tx.signed_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
      cfd::core::ScriptWitness::GetWitness(&local_2a0,&local_288);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&witness_stack,&local_2a0);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_2a0);
      cfd::core::ScriptWitness::~ScriptWitness(&local_288);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)&tx);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&ref);
    }
    if ((ulong)stack_index <
        (ulong)(((long)witness_stack.
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)witness_stack.
                      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x18)) {
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)&tx,
                 witness_stack.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_start + stack_index);
      pcVar2 = cfd::capi::CreateString((string *)&tx);
      *stack_data = pcVar2;
      std::__cxx11::string::~string((string *)&tx);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                (&witness_stack);
      return 0;
    }
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5277c7;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0xa28;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_83e357;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"stackIndex is illegal.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. stackIndex out of witness stack.",
               (allocator *)&ref);
    cfd::core::CfdException::CfdException(pCVar3,kCfdOutOfRangeError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x5277c7;
  tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0xa0f;
  tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_83e357;
  cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"stack data is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&tx,"Failed to parameter. stack data is null.",(allocator *)&ref);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInWitness(
    void* handle, int net_type, const char* tx_hex_string, uint32_t txin_index,
    uint32_t stack_index, char** stack_data) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (stack_data == nullptr) {
      warn(CFD_LOG_SOURCE, "stack data is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. stack data is null.");
    }

    std::vector<ByteData> witness_stack;
    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      const TxInReference ref = tx.GetTxIn(txin_index);
      witness_stack = ref.GetScriptWitness().GetWitness();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      const ConfidentialTxInReference ref = tx.GetTxIn(txin_index);
      witness_stack = ref.GetScriptWitness().GetWitness();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (witness_stack.size() <= stack_index) {
      warn(CFD_LOG_SOURCE, "stackIndex is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. stackIndex out of witness stack.");
    }
    *stack_data = CreateString(witness_stack[stack_index].GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}